

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O0

void __thiscall QVarLengthArray<QImage,_4LL>::~QVarLengthArray(QVarLengthArray<QImage,_4LL> *this)

{
  QVLABaseBase *pQVar1;
  QImage *ptr;
  QVLABaseBase *in_RDI;
  size_t in_stack_ffffffffffffffd8;
  QImage *in_stack_ffffffffffffffe0;
  
  QVLABase<QImage>::data((QVLABase<QImage> *)in_RDI);
  QVLABaseBase::size(in_RDI);
  std::destroy_n<QImage*,long_long>(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  pQVar1 = (QVLABaseBase *)QVLABase<QImage>::data((QVLABase<QImage> *)in_RDI);
  if (pQVar1 != in_RDI + 1) {
    ptr = QVLABase<QImage>::data((QVLABase<QImage> *)in_RDI);
    QVLABaseBase::capacity(in_RDI);
    QtPrivate::sizedFree(ptr,in_stack_ffffffffffffffd8,0x93b01b);
  }
  return;
}

Assistant:

inline ~QVarLengthArray()
    {
        if constexpr (QTypeInfo<T>::isComplex)
            std::destroy_n(data(), size());
        if (data() != reinterpret_cast<T *>(this->array))
            QtPrivate::sizedFree(data(), capacity(), sizeof(T));
    }